

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.c
# Opt level: O3

sexp sexp_register_type_op
               (sexp ctx,sexp self,sexp_sint_t n,sexp name,sexp parent,sexp slots,sexp fb,sexp felb,
               sexp flb,sexp flo,sexp fls,sexp sb,sexp so,sexp sc,sexp w,sexp wb,sexp wo,sexp ws,
               sexp we,sexp p,char *fname,sexp_proc2 f)

{
  sexp psVar1;
  sexp psVar2;
  sexp psVar3;
  ulong uVar4;
  int *piVar5;
  sexp psVar6;
  char *pcVar7;
  char *pcVar8;
  sexp_uint_t sVar9;
  sexp local_60;
  sexp local_58;
  sexp_gc_var_t local_50;
  sexp_gc_var_t local_40;
  
  local_50.var = &local_58;
  local_58 = (sexp)&DAT_0000043e;
  local_40.var = &local_60;
  local_60 = (sexp)0x43e;
  psVar3 = (ctx->value).type.setters;
  psVar1 = (psVar3->value).type.id;
  pcVar7 = (char *)((long)psVar1 >> 1);
  pcVar8 = ((psVar3->value).port.stream)->_IO_read_ptr;
  local_40.next = &local_50;
  local_50.next = (ctx->value).context.saves;
  (ctx->value).context.saves = &local_40;
  if (pcVar7 < (char *)0xffffffff) {
    if ((((ulong)name & 3) == 0) && (name->tag == 9)) {
      if (pcVar8 <= pcVar7) {
        uVar4 = (long)pcVar8 * 2;
        if (0xfffffffe < uVar4) {
          uVar4 = 0xffffffff;
        }
        local_58 = sexp_make_vector_op(ctx,(sexp)0x0,(sexp_sint_t)local_40.var,(sexp)(uVar4 * 2 + 1)
                                       ,(sexp)&DAT_0000043e);
        if ((((ulong)local_58 & 3) == 0) && (psVar3 = local_58, local_58->tag == 0x13))
        goto LAB_0010e5a3;
        psVar3 = (ctx->value).type.setters;
        if ((sexp)0x1 < psVar1) {
          psVar3 = (psVar3->value).type.getters;
          pcVar8 = (char *)0x0;
          do {
            *(undefined8 *)((long)&local_58->value + (long)pcVar8 * 8 + 8) =
                 *(undefined8 *)((long)&psVar3->value + (long)pcVar8 * 8 + 8);
            pcVar8 = pcVar8 + 1;
          } while (pcVar7 + (pcVar7 == (char *)0x0) != pcVar8);
          psVar3 = (ctx->value).type.setters;
        }
        (psVar3->value).type.getters = local_58;
      }
      piVar5 = (int *)sexp_alloc(ctx,0x78);
      if ((piVar5 != (int *)0x0) && ((((ulong)piVar5 & 3) != 0 || (*piVar5 != 0x13)))) {
        *piVar5 = 1;
      }
      *(int **)((long)&((((ctx->value).type.setters)->value).type.getters)->value +
               (long)pcVar7 * 8 + 8) = piVar5;
      local_60 = *(sexp *)((long)&((((ctx->value).type.setters)->value).type.getters)->value +
                          (long)pcVar7 * 8 + 8);
      if ((((ulong)local_60 & 3) != 0) || (psVar3 = local_60, local_60->tag != 0x13)) {
        local_60->tag = 1;
        (local_60->value).type.tag = (sexp_tag_t)pcVar7;
        (local_60->value).type.slots = slots;
        (local_60->value).type.field_base = (short)((ulong)fb >> 1);
        (local_60->value).type.field_eq_len_base = (short)((ulong)felb >> 1);
        (local_60->value).type.field_len_base = (short)((ulong)flb >> 1);
        (local_60->value).type.field_len_off = (short)((ulong)flo >> 1);
        (local_60->value).type.field_len_scale = (unsigned_short)((ulong)fls >> 1);
        (local_60->value).type.size_base = (short)((ulong)sb >> 1);
        (local_60->value).type.size_off = (short)((ulong)so >> 1);
        (local_60->value).type.size_scale = (unsigned_short)((ulong)sc >> 1);
        (local_60->value).type.weak_base = (short)((ulong)w >> 1);
        (local_60->value).type.weak_len_base = (short)((ulong)wb >> 1);
        (local_60->value).type.weak_len_off = (short)((ulong)wo >> 1);
        (local_60->value).type.weak_len_scale = (short)((ulong)ws >> 1);
        (local_60->value).type.weak_len_extra = (short)((ulong)we >> 1);
        (local_60->value).type.name = name;
        (local_60->value).bytecode.length = 0x3e;
        (local_60->value).bytecode.max_depth = 0x3e;
        (local_60->value).type.finalize = f;
        if (fname == (char *)0x0) {
          psVar3 = (sexp)0x0;
        }
        else {
          psVar3 = sexp_c_string(ctx,fname,-1);
        }
        (local_60->value).type.finalize_name = psVar3;
        (local_60->value).type.id = (sexp)0x3e;
        if (f != (sexp_proc2)0x0) {
          (local_60->value).type.dl = (sexp)(ctx->value).opcode.func;
        }
        (local_60->value).type.print = p;
        if ((((ulong)parent & 3) == 0 && parent != (sexp)0x0) && (parent->tag == 1)) {
          psVar3 = (parent->value).type.cpl;
          sVar9 = 1;
          if ((((ulong)psVar3 & 3) == 0) && (psVar3->tag == 10)) {
            sVar9 = (psVar3->value).stack.length;
          }
          psVar6 = sexp_make_vector_op(ctx,(sexp)0x0,(sexp_sint_t)p,(sexp)(sVar9 * 2 + 3),
                                       (sexp)&DAT_0000043e);
          psVar3 = local_60;
          (local_60->value).type.cpl = psVar6;
          psVar2 = (parent->value).type.cpl;
          if ((((ulong)psVar2 & 3) == 0) && (psVar2->tag == 10)) {
            memcpy((void *)((long)&psVar6->value + 8),(void *)((long)&psVar2->value + 8),sVar9 * 8);
          }
          else {
            *(sexp *)((long)&psVar6->value + sVar9 * 8) = parent;
          }
        }
        else {
          sVar9 = 0;
          psVar3 = sexp_make_vector_op(ctx,(sexp)0x0,(sexp_sint_t)p,(sexp)&DAT_00000003,
                                       (sexp)&DAT_0000043e);
          (local_60->value).type.cpl = psVar3;
          psVar3 = local_60;
        }
        *(sexp *)((long)&((psVar3->value).type.cpl)->value + sVar9 * 8 + 8) = psVar3;
        (local_60->value).type.depth = (short)sVar9;
        (((ctx->value).type.setters)->value).type.id = (sexp)(((ulong)psVar1 | 1) + 2);
        psVar3 = local_60;
      }
    }
    else {
      psVar3 = sexp_type_exception(ctx,self,9,name);
    }
  }
  else {
    psVar3 = sexp_user_exception(ctx,self,"register-type: exceeded maximum type limit",name);
  }
LAB_0010e5a3:
  (ctx->value).context.saves = local_50.next;
  return psVar3;
}

Assistant:

sexp sexp_register_type_op (sexp ctx, sexp self, sexp_sint_t n, sexp name,
                            sexp parent, sexp slots,
                            sexp fb, sexp felb, sexp flb, sexp flo, sexp fls,
                            sexp sb, sexp so, sexp sc, sexp w, sexp wb, sexp wo,
                            sexp ws, sexp we, sexp p, const char* fname, sexp_proc2 f) {
  sexp *v1, *v2;
  sexp_gc_var2(res, type);
  sexp_uint_t i, len, num_types=sexp_context_num_types(ctx),
    type_array_size=sexp_context_type_array_size(ctx);
  sexp_gc_preserve2(ctx, res, type);
  if (num_types >= SEXP_MAXIMUM_TYPES) {
    res = sexp_user_exception(ctx, self, "register-type: exceeded maximum type limit", name);
  } else if (! sexp_stringp(name)) {
    res = sexp_type_exception(ctx, self, SEXP_STRING, name);
  } else {
    if (num_types >= type_array_size) {
      len = type_array_size*2;
      if (len > SEXP_MAXIMUM_TYPES) len = SEXP_MAXIMUM_TYPES;
      res = sexp_make_vector(ctx, sexp_make_fixnum(len), SEXP_VOID);
      if (sexp_exceptionp(res)) {
        sexp_gc_release2(ctx);
        return res;
      }
      v1 = sexp_vector_data(res);
      v2 = sexp_vector_data(sexp_global(ctx, SEXP_G_TYPES));
      for (i=0; i<num_types; i++)
        v1[i] = v2[i];
      sexp_global(ctx, SEXP_G_TYPES) = res;
    }
    sexp_type_by_index(ctx, num_types) = sexp_alloc_type(ctx, type, SEXP_TYPE);
    type = sexp_type_by_index(ctx, num_types);
    if (!sexp_exceptionp(type)) {
      sexp_pointer_tag(type) = SEXP_TYPE;
      sexp_type_tag(type) = num_types;
      sexp_type_slots(type) = slots;
      sexp_type_field_base(type) = (short)sexp_unbox_fixnum(fb);
      sexp_type_field_eq_len_base(type) = (short)sexp_unbox_fixnum(felb);
      sexp_type_field_len_base(type) = (short)sexp_unbox_fixnum(flb);
      sexp_type_field_len_off(type) = (short)sexp_unbox_fixnum(flo);
      sexp_type_field_len_scale(type) = (unsigned short)sexp_unbox_fixnum(fls);
      sexp_type_size_base(type) = (short)sexp_unbox_fixnum(sb);
      sexp_type_size_off(type) = (short)sexp_unbox_fixnum(so);
      sexp_type_size_scale(type) = (unsigned short)sexp_unbox_fixnum(sc);
      sexp_type_weak_base(type) = (short)sexp_unbox_fixnum(w);
      sexp_type_weak_len_base(type) = (short)sexp_unbox_fixnum(wb);
      sexp_type_weak_len_off(type) = (short)sexp_unbox_fixnum(wo);
      sexp_type_weak_len_scale(type) = (short)sexp_unbox_fixnum(ws);
      sexp_type_weak_len_extra(type) = (short)sexp_unbox_fixnum(we);
      sexp_type_name(type) = name;
      sexp_type_getters(type) = SEXP_FALSE;
      sexp_type_setters(type) = SEXP_FALSE;
      sexp_type_finalize(type) = f;
      sexp_type_finalize_name(type) = (fname) ? sexp_c_string(ctx, fname, -1) : NULL;
      sexp_type_id(type) = SEXP_FALSE;
#if SEXP_USE_DL
      if (f) sexp_type_dl(type) = sexp_context_dl(ctx);
#endif
      sexp_type_print(type) = p;
      if (parent && sexp_typep(parent)) {
        len = sexp_vectorp(sexp_type_cpl(parent)) ? sexp_vector_length(sexp_type_cpl(parent)) : 1;
        sexp_type_cpl(type) = sexp_make_vector(ctx, sexp_make_fixnum(len+1), SEXP_VOID);
        if (parent && sexp_vectorp(sexp_type_cpl(parent)))
          memcpy(sexp_vector_data(sexp_type_cpl(type)),
                 sexp_vector_data(sexp_type_cpl(parent)),
                 len * sizeof(sexp));
        else
          sexp_vector_data(sexp_type_cpl(type))[len-1] = parent;
      } else {
        len = 0;
        sexp_type_cpl(type) = sexp_make_vector(ctx, SEXP_ONE, SEXP_VOID);
      }
      sexp_vector_data(sexp_type_cpl(type))[len] = type;
      sexp_type_depth(type) = (short)len;
      sexp_global(ctx, SEXP_G_NUM_TYPES) = sexp_make_fixnum(num_types + 1);
    }
    res = type;
  }
  sexp_gc_release2(ctx);
  return res;
}